

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_addLiteral
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t literalValue)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_object_tuple_t *value;
  sysbvm_tuple_t existent;
  sysbvm_object_tuple_t *local_30;
  
  local_30 = (sysbvm_object_tuple_t *)0x0;
  _Var1 = sysbvm_identityDictionary_find
                    (assembler->literalDictionary,literalValue,(sysbvm_tuple_t *)&local_30);
  if (!_Var1) {
    sVar2 = sysbvm_orderedCollection_getSize(assembler->literals);
    value = sysbvm_context_allocatePointerTuple
                      (context,(context->roots).functionBytecodeAssemblerVectorOperand,0xb);
    value[1].header.field_0.typePointer = 0x27;
    (value->field_1).pointers[0] = (long)(short)sVar2 << 4 | 7;
    value[1].header.identityHashAndFlags = 0xf;
    value[1].header.objectSize = 0;
    value[1].field_1.pointers[0] = 0xf;
    value[2].header.field_0.typePointer = 0xf;
    value[2].header.identityHashAndFlags = 0xf;
    value[2].header.objectSize = 0;
    value[2].field_1.pointers[0] = 0xf;
    value[3].header.field_0.typePointer = 0xf;
    value[3].header.identityHashAndFlags = 0xf;
    value[3].header.objectSize = 0;
    sysbvm_orderedCollection_add(context,assembler->literals,literalValue);
    sysbvm_identityDictionary_atPut
              (context,assembler->literalDictionary,literalValue,(sysbvm_tuple_t)value);
    local_30 = value;
  }
  return (sysbvm_tuple_t)local_30;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_addLiteral(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t literalValue)
{
    sysbvm_tuple_t existent = SYSBVM_NULL_TUPLE;
    if(sysbvm_identityDictionary_find(assembler->literalDictionary, literalValue, &existent))
        return existent;

    size_t literalIndex = sysbvm_orderedCollection_getSize(assembler->literals);
    sysbvm_tuple_t newLiteralOperand = sysbvm_functionBytecodeAssemblerVectorOperand_create(context, SYSBVM_OPERAND_VECTOR_LITERAL, (int16_t)literalIndex);
    sysbvm_orderedCollection_add(context, assembler->literals, literalValue);
    sysbvm_identityDictionary_atPut(context, assembler->literalDictionary, literalValue, newLiteralOperand);
    return newLiteralOperand;
}